

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  Type TVar1;
  Addr addr;
  CfgNode *pCVar2;
  bool bVar3;
  
  if (node != (CfgNode *)0x0) {
    TVar1 = node->m_type;
    if (TVar1 == CFG_HALT) {
      bVar3 = this->m_haltNode == node;
    }
    else if (TVar1 == CFG_EXIT) {
      bVar3 = this->m_exitNode == node;
    }
    else if (TVar1 == CFG_ENTRY) {
      bVar3 = this->m_entryNode == node;
    }
    else {
      addr = CfgNode::node2addr(node);
      pCVar2 = nodeByAddr(this,addr);
      bVar3 = pCVar2 == node;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool CFG::containsNode(CfgNode* node) {
	if (!node)
		return false;

	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return node == m_entryNode;
		case CfgNode::CFG_EXIT:
			return node == m_exitNode;
		case CfgNode::CFG_HALT:
			return node == m_haltNode;
		default:
			CfgNode* tmp = CFG::nodeByAddr(CfgNode::node2addr(node));
			return tmp == node;
	}
}